

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

uint32 __thiscall
IRBuilderAsmJs::GetTypedRegFromRegSlot(IRBuilderAsmJs *this,RegSlot reg,Types type)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  uint local_30;
  undefined1 local_2c [4];
  RegSlot srcReg;
  TypedSlotInfo typedInfo;
  Types type_local;
  RegSlot reg_local;
  IRBuilderAsmJs *this_local;
  
  typedInfo.byteOffset = type;
  typedInfo.constSrcByteOffset = reg;
  AsmJsJITInfo::GetTypedSlotInfo((TypedSlotInfo *)local_2c,this->m_asmFuncInfo,type);
  local_30 = typedInfo.constSrcByteOffset;
  bVar3 = RegIsTypedVar(this,typedInfo.constSrcByteOffset,typedInfo.byteOffset);
  TVar2 = typedInfo.constSrcByteOffset;
  if (bVar3) {
    RVar4 = GetFirstVar(this,typedInfo.byteOffset);
    if (srcReg <= TVar2 - RVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x1b6,"(srcReg < typedInfo.varCount)","srcReg < typedInfo.varCount");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    local_30 = (int)local_2c + (TVar2 - RVar4);
  }
  else {
    bVar3 = RegIsTemp(this,typedInfo.constSrcByteOffset);
    TVar2 = typedInfo.constSrcByteOffset;
    if (bVar3) {
      RVar4 = GetFirstTmp(this,typedInfo.byteOffset);
      if (typedInfo.constCount <= TVar2 - RVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1bc,"(srcReg < typedInfo.tmpCount)","srcReg < typedInfo.tmpCount");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_30 = srcReg + (int)local_2c + (TVar2 - RVar4);
    }
    else {
      bVar3 = RegIsConstant(this,typedInfo.constSrcByteOffset);
      TVar2 = typedInfo.constSrcByteOffset;
      if (bVar3) {
        RVar4 = GetFirstConst(this,typedInfo.byteOffset);
        local_30 = TVar2 - RVar4;
        if ((uint)local_2c <= local_30) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x1c2,"(srcReg < typedInfo.constCount)",
                             "srcReg < typedInfo.constCount");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
  }
  return local_30;
}

Assistant:

uint32 IRBuilderAsmJs::GetTypedRegFromRegSlot(Js::RegSlot reg, WAsmJs::Types type)
{
    const auto typedInfo = m_asmFuncInfo->GetTypedSlotInfo(type);
    Js::RegSlot srcReg = reg;
    if (RegIsTypedVar(reg, type))
    {
        srcReg = reg - GetFirstVar(type);
        Assert(srcReg < typedInfo.varCount);
        srcReg += typedInfo.constCount;
    }
    else if (RegIsTemp(reg))
    {
        srcReg = reg - GetFirstTmp(type);
        Assert(srcReg < typedInfo.tmpCount);
        srcReg += typedInfo.varCount + typedInfo.constCount;
    }
    else if (RegIsConstant(reg))
    {
        srcReg = reg - GetFirstConst(type);
        Assert(srcReg < typedInfo.constCount);
    }
    return srcReg;
}